

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O0

links_entry * find_entry(archive_entry_linkresolver *res,archive_entry *entry)

{
  dev_t dVar1;
  ulong uVar2;
  ulong uVar3;
  dev_t dVar4;
  ulong uVar5;
  int64_t ino;
  dev_t dev;
  size_t bucket;
  size_t hash;
  links_entry *le;
  archive_entry *entry_local;
  archive_entry_linkresolver *res_local;
  
  if (res->spare != (links_entry *)0x0) {
    archive_entry_free(res->spare->canonical);
    archive_entry_free(res->spare->entry);
    free(res->spare);
    res->spare = (links_entry *)0x0;
  }
  dVar1 = archive_entry_dev(entry);
  uVar2 = archive_entry_ino64(entry);
  uVar3 = (dVar1 ^ uVar2) & res->number_buckets - 1;
  hash = (size_t)res->buckets[uVar3];
  while( true ) {
    if (hash == 0) {
      return (links_entry *)0x0;
    }
    if (((*(ulong *)(hash + 0x20) == (dVar1 ^ uVar2)) &&
        (dVar4 = archive_entry_dev(*(archive_entry **)(hash + 0x10)), dVar1 == dVar4)) &&
       (uVar5 = archive_entry_ino64(*(archive_entry **)(hash + 0x10)), uVar2 == uVar5)) break;
    hash = *(size_t *)hash;
  }
  *(int *)(hash + 0x28) = *(int *)(hash + 0x28) + -1;
  if (*(int *)(hash + 0x28) != 0) {
    return (links_entry *)hash;
  }
  if (*(long *)(hash + 8) != 0) {
    **(undefined8 **)(hash + 8) = *(undefined8 *)hash;
  }
  if (*(long *)hash != 0) {
    *(undefined8 *)(*(long *)hash + 8) = *(undefined8 *)(hash + 8);
  }
  if (res->buckets[uVar3] == (links_entry *)hash) {
    res->buckets[uVar3] = *(links_entry **)hash;
  }
  res->number_entries = res->number_entries - 1;
  res->spare = (links_entry *)hash;
  return (links_entry *)hash;
}

Assistant:

static struct links_entry *
find_entry(struct archive_entry_linkresolver *res,
    struct archive_entry *entry)
{
	struct links_entry	*le;
	size_t			 hash, bucket;
	dev_t			 dev;
	int64_t			 ino;

	/* Free a held entry. */
	if (res->spare != NULL) {
		archive_entry_free(res->spare->canonical);
		archive_entry_free(res->spare->entry);
		free(res->spare);
		res->spare = NULL;
	}

	dev = archive_entry_dev(entry);
	ino = archive_entry_ino64(entry);
	hash = (size_t)(dev ^ ino);

	/* Try to locate this entry in the links cache. */
	bucket = hash & (res->number_buckets - 1);
	for (le = res->buckets[bucket]; le != NULL; le = le->next) {
		if (le->hash == hash
		    && dev == archive_entry_dev(le->canonical)
		    && ino == archive_entry_ino64(le->canonical)) {
			/*
			 * Decrement link count each time and release
			 * the entry if it hits zero.  This saves
			 * memory and is necessary for detecting
			 * missed links.
			 */
			--le->links;
			if (le->links > 0)
				return (le);
			/* Remove it from this hash bucket. */
			if (le->previous != NULL)
				le->previous->next = le->next;
			if (le->next != NULL)
				le->next->previous = le->previous;
			if (res->buckets[bucket] == le)
				res->buckets[bucket] = le->next;
			res->number_entries--;
			/* Defer freeing this entry. */
			res->spare = le;
			return (le);
		}
	}
	return (NULL);
}